

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O3

void __thiscall
QTextDocumentPrivate::clearUndoRedoStacks
          (QTextDocumentPrivate *this,Stacks stacksToClear,bool emitSignals)

{
  QList<QTextUndoCommand> *this_00;
  QTextUndoCommand *pQVar1;
  long *plVar2;
  Data *pDVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  int i;
  ulong uVar9;
  ulong n;
  
  iVar7 = this->undoState;
  n = (ulong)iVar7;
  this_00 = &this->undoStack;
  if (stacksToClear != UndoStack || iVar7 == 0) {
    uVar6 = (this->undoStack).d.size;
    if (stacksToClear == RedoStack && uVar6 != n) {
      if ((long)n < (long)uVar6) {
        uVar8 = n << 5 | 0x10;
        do {
          pQVar1 = (this->undoStack).d.ptr;
          plVar2 = *(long **)((long)&pQVar1->command + uVar8);
          if (plVar2 != (long *)0x0 && (*(byte *)((long)pQVar1 + (uVar8 - 0xf)) & 1) != 0) {
            (**(code **)(*plVar2 + 8))();
            uVar6 = (this->undoStack).d.size;
          }
          n = n + 1;
          uVar8 = uVar8 + 0x20;
        } while ((long)n < (long)uVar6);
        n = (ulong)this->undoState;
      }
      QList<QTextUndoCommand>::resize(this_00,n);
      if (!emitSignals) {
        return;
      }
    }
    else {
      if (uVar6 == 0 || stacksToClear != UndoAndRedoStacks) {
        return;
      }
      lVar4 = 0x10;
      uVar9 = 0;
      uVar8 = uVar6;
      do {
        pQVar1 = (this->undoStack).d.ptr;
        plVar2 = *(long **)((long)&pQVar1->command + lVar4);
        if (plVar2 != (long *)0x0 && (*(byte *)((long)pQVar1 + lVar4 + -0xf) & 1) != 0) {
          (**(code **)(*plVar2 + 8))();
          uVar8 = (this->undoStack).d.size;
        }
        uVar9 = uVar9 + 1;
        lVar4 = lVar4 + 0x20;
      } while (uVar9 < uVar8);
      this->undoState = 0;
      QList<QTextUndoCommand>::clear(this_00);
      if ((iVar7 != 0 && emitSignals) && (this->wasUndoAvailable != false)) {
        QTextDocument::undoAvailable(*(QTextDocument **)&this->field_0x8,false);
        this->wasUndoAvailable = false;
      }
      if (!emitSignals || uVar6 == n) {
        return;
      }
    }
    if (this->wasRedoAvailable == false) {
      return;
    }
    QTextDocument::redoAvailable(*(QTextDocument **)&this->field_0x8,false);
    this->wasRedoAvailable = false;
    return;
  }
  if (0 < iVar7) {
    lVar5 = 0x10;
    lVar4 = 0;
    do {
      pQVar1 = (this->undoStack).d.ptr;
      plVar2 = *(long **)((long)&pQVar1->command + lVar5);
      if (plVar2 != (long *)0x0 && (*(byte *)((long)pQVar1 + lVar5 + -0xf) & 1) != 0) {
        (**(code **)(*plVar2 + 8))();
        iVar7 = this->undoState;
      }
      lVar4 = lVar4 + 1;
      n = (ulong)iVar7;
      lVar5 = lVar5 + 0x20;
    } while (lVar4 < (long)n);
    if (iVar7 == 0) goto LAB_004d071f;
  }
  pDVar3 = (this_00->d).d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QArrayDataPointer<QTextUndoCommand>::reallocateAndGrow
              (&this_00->d,GrowsAtEnd,0,(QArrayDataPointer<QTextUndoCommand> *)0x0);
  }
  QtPrivate::QPodArrayOps<QTextUndoCommand>::erase
            ((QPodArrayOps<QTextUndoCommand> *)this_00,(this->undoStack).d.ptr,n);
LAB_004d071f:
  this->undoState = 0;
  if ((emitSignals) && (this->wasUndoAvailable != false)) {
    QTextDocument::undoAvailable(*(QTextDocument **)&this->field_0x8,false);
    this->wasUndoAvailable = false;
  }
  return;
}

Assistant:

void QTextDocumentPrivate::clearUndoRedoStacks(QTextDocument::Stacks stacksToClear,
                                               bool emitSignals)
{
    bool undoCommandsAvailable = undoState != 0;
    bool redoCommandsAvailable = undoState != undoStack.size();
    if (stacksToClear == QTextDocument::UndoStack && undoCommandsAvailable) {
        for (int i = 0; i < undoState; ++i) {
            QTextUndoCommand c = undoStack.at(i);
            if (c.command & QTextUndoCommand::Custom)
                delete c.custom;
        }
        undoStack.remove(0, undoState);
        undoState = 0;
        if (emitSignals)
            emitUndoAvailable(false);
    } else if (stacksToClear == QTextDocument::RedoStack
               && redoCommandsAvailable) {
        for (int i = undoState; i < undoStack.size(); ++i) {
            QTextUndoCommand c = undoStack.at(i);
            if (c.command & QTextUndoCommand::Custom)
                delete c.custom;
        }
        undoStack.resize(undoState);
        if (emitSignals)
            emitRedoAvailable(false);
    } else if (stacksToClear == QTextDocument::UndoAndRedoStacks
               && !undoStack.isEmpty()) {
        for (int i = 0; i < undoStack.size(); ++i) {
            QTextUndoCommand c = undoStack.at(i);
            if (c.command & QTextUndoCommand::Custom)
                delete c.custom;
        }
        undoState = 0;
        undoStack.clear();
        if (emitSignals && undoCommandsAvailable)
            emitUndoAvailable(false);
        if (emitSignals && redoCommandsAvailable)
            emitRedoAvailable(false);
    }
}